

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O0

bool __thiscall Am_Inter_Location::Is_Zero_Size(Am_Inter_Location *this)

{
  Am_Inter_Location *this_local;
  
  if (this->data == (Am_Inter_Location_Data *)0x0) {
    Am_Error("Am_Inter_Location not initialized");
  }
  if ((this->data->as_line & 1U) == 0) {
    if (((this->data->data).rect.width < 1) || ((this->data->data).rect.height < 1)) {
      return true;
    }
  }
  else if (((this->data->data).rect.left == (this->data->data).rect.width) &&
          ((this->data->data).rect.top == (this->data->data).rect.height)) {
    return true;
  }
  return false;
}

Assistant:

bool
Am_Inter_Location::Is_Zero_Size() const
{
  if (!data)
    Am_Error("Am_Inter_Location not initialized");
  if (data->as_line) {
    if (data->data.line.x1 == data->data.line.x2 &&
        data->data.line.y1 == data->data.line.y2)
      return true;
  } else {
    if (data->data.rect.width <= 0 || data->data.rect.height <= 0)
      return true;
  }
  return false;
}